

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonLibTests_Parsing.c
# Opt level: O0

WJTL_STATUS VerifyJsonParsesAsNumberObjectFloat(_Bool IsJson5,char *Json,double Number)

{
  JL_STATUS JVar1;
  bool bVar2;
  _Bool _result_6;
  _Bool _result_5;
  _Bool _result_4;
  _Bool _result_3;
  _Bool _result_2;
  _Bool _result_1;
  double dStack_40;
  _Bool _result;
  double numfloat;
  size_t sStack_30;
  WJTL_STATUS TestReturn;
  size_t errorAtPos;
  JlDataObject *object;
  double Number_local;
  char *Json_local;
  _Bool IsJson5_local;
  
  errorAtPos = 0;
  sStack_30 = 100;
  numfloat._4_4_ = WJTL_STATUS_SUCCESS;
  object = (JlDataObject *)Number;
  Number_local = (double)Json;
  Json_local._7_1_ = IsJson5;
  JVar1 = JlParseJsonEx(Json,IsJson5,(JlDataObject **)&errorAtPos,&stack0xffffffffffffffd0);
  WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                   "((JL_STATUS)(JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ))) == (JL_STATUS_SUCCESS)"
                   ,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                   ,"VerifyJsonParsesAsNumberObjectFloat",0x11a);
  if (JVar1 != JL_STATUS_SUCCESS) {
    numfloat._4_4_ = WJTL_STATUS_FAILED;
  }
  if (errorAtPos != 0) {
    bVar2 = errorAtPos != 0;
    WjTestLib_Assert(bVar2,"(object) != NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x11d);
    if (!bVar2) {
      numfloat._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar2 = sStack_30 == 0;
    WjTestLib_Assert(bVar2,"errorAtPos == 0",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x11e);
    if (!bVar2) {
      numfloat._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlGetObjectNumberF64((JlDataObject *)errorAtPos,&stack0xffffffffffffffc0);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlGetObjectNumberF64( object, &numfloat ))) == (JL_STATUS_SUCCESS)"
                     ,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x120);
    if (JVar1 != JL_STATUS_SUCCESS) {
      numfloat._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar2 = (double)object == dStack_40;
    WjTestLib_Assert(bVar2,"Number == numfloat",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x121);
    if (!bVar2) {
      numfloat._4_4_ = WJTL_STATUS_FAILED;
    }
    JVar1 = JlFreeObjectTree((JlDataObject **)&errorAtPos);
    WjTestLib_Assert(JVar1 == JL_STATUS_SUCCESS,
                     "((JL_STATUS)(JlFreeObjectTree( &object ))) == (JL_STATUS_SUCCESS)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x123);
    if (JVar1 != JL_STATUS_SUCCESS) {
      numfloat._4_4_ = WJTL_STATUS_FAILED;
    }
    bVar2 = errorAtPos == 0;
    WjTestLib_Assert(bVar2,"(object) == NULL",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/WaterJuice[P]JsonLib/projects/JsonLibTests/Source/JsonLibTests_Parsing.c"
                     ,"VerifyJsonParsesAsNumberObjectFloat",0x124);
    if (!bVar2) {
      numfloat._4_4_ = WJTL_STATUS_FAILED;
    }
  }
  return numfloat._4_4_;
}

Assistant:

static
WJTL_STATUS
    VerifyJsonParsesAsNumberObjectFloat
    (
        bool            IsJson5,
        char const*     Json,
        double          Number
    )
{
    JlDataObject*   object = NULL;
    size_t          errorAtPos = 100;
    WJTL_STATUS     TestReturn = WJTL_STATUS_SUCCESS;
    double          numfloat;

    JL_ASSERT_SUCCESS( JlParseJsonEx( Json, IsJson5, &object, &errorAtPos ) );
    if( NULL != object )
    {
        JL_ASSERT_NOT_NULL( object );
        JL_ASSERT( errorAtPos == 0 );

        JL_ASSERT_SUCCESS( JlGetObjectNumberF64( object, &numfloat ) );
        JL_ASSERT( Number == numfloat );

        JL_ASSERT_SUCCESS( JlFreeObjectTree( &object ) );
        JL_ASSERT_NULL( object );
    }

    return TestReturn;
}